

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1objs.c
# Opt level: O1

FT_Error T1_Size_Init(FT_Size t1size)

{
  FT_Error FVar1;
  PSH_Globals_Funcs pPVar2;
  PSH_Globals globals;
  PSH_Globals local_10;
  
  pPVar2 = T1_Size_Get_Globals_Funcs((T1_Size)t1size);
  if (pPVar2 == (PSH_Globals_Funcs)0x0) {
    FVar1 = 0;
  }
  else {
    FVar1 = (*pPVar2->create)(t1size->face->memory,(T1_Private *)&t1size->face[1].available_sizes,
                              &local_10);
    if (FVar1 == 0) {
      t1size->internal->module_data = local_10;
    }
  }
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Size_Init( FT_Size  t1size )      /* T1_Size */
  {
    T1_Size            size  = (T1_Size)t1size;
    FT_Error           error = FT_Err_Ok;
    PSH_Globals_Funcs  funcs = T1_Size_Get_Globals_Funcs( size );


    if ( funcs )
    {
      PSH_Globals  globals;
      T1_Face      face = (T1_Face)size->root.face;


      error = funcs->create( size->root.face->memory,
                             &face->type1.private_dict, &globals );
      if ( !error )
        t1size->internal->module_data = globals;
    }

    return error;
  }